

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O1

void __thiscall
solitaire::SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::TableauPileMock>
          (SolitaireEmptyHandTest *this,TableauPileMock *pile,StrictSnapshotMockPtr *snapshot)

{
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_00;
  pointer *__ptr;
  undefined1 local_68 [8];
  ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
  local_60;
  testing local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Any_data local_48;
  code *local_38;
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  local_28;
  
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&(pile->gmock00_createSnapshot_13).super_UntypedFunctionMockerBase,pile);
  local_28.function_mocker_ = &pile->gmock00_createSnapshot_13;
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
            ::InternalExpectedAt
                      (&local_28,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xd4,"pile","createSnapshot()");
  mock_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>_>::make_unique
            ((mock_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>_> *)local_68);
  local_60.payload._M_t.
  super___uniq_ptr_impl<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
  .super__Head_base<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_false>.
  _M_head_impl = (unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
                  )(unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
                    )local_68;
  local_68 = (undefined1  [8])0x0;
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>>>>>
            (local_58,&local_60);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
              *)&local_48,(ReturnAction *)local_58);
  testing::internal::
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::WillOnce(this_00,(Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                      *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_60.payload._M_t.
      super___uniq_ptr_impl<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
      .super__Head_base<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_60.payload._M_t.
                          super___uniq_ptr_impl<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
                          .
                          super__Head_base<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_60.payload._M_t.
  super___uniq_ptr_impl<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
  .super__Head_base<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_false>.
  _M_head_impl = (unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
                  )(__uniq_ptr_data<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>,_true,_true>
                    )0x0;
  if (local_68 != (undefined1  [8])0x0) {
    (*(((SnapshotMock *)local_68)->super_Snapshot)._vptr_Snapshot[1])();
  }
  return;
}

Assistant:

void expectSnapshotCreation(Pile& pile, StrictSnapshotMockPtr& snapshot) {
        EXPECT_CALL(pile, createSnapshot())
            .WillOnce(Return(ByMove(snapshot.make_unique())));
    }